

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  seqStore_t *psVar4;
  U32 lowestValid;
  ulong *puVar5;
  seqDef *psVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong *puVar14;
  uint uVar15;
  int iVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong *puVar19;
  BYTE *pBVar20;
  BYTE *litEnd;
  uint uVar21;
  ulong uVar22;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  uint local_bc;
  size_t local_b8;
  uint local_b0;
  uint local_ac;
  ZSTD_matchState_t *local_a8;
  ulong *local_a0;
  ulong *local_98;
  ulong local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  seqStore_t *local_50;
  BYTE *local_48;
  ulong *local_40;
  uint *local_38;
  
  puVar19 = (ulong *)((long)src + srcSize);
  pBVar20 = (ms->window).base;
  uVar21 = (ms->window).dictLimit;
  local_48 = pBVar20 + uVar21;
  uVar15 = (ms->cParams).minMatch;
  uVar11 = 6;
  if (uVar15 < 6) {
    uVar11 = uVar15;
  }
  local_ac = 4;
  if (4 < uVar11) {
    local_ac = uVar11;
  }
  local_54 = *rep;
  puVar10 = (ulong *)((ulong)((int)src == (int)local_48) + (long)src);
  iVar16 = (int)puVar10 - (int)pBVar20;
  uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_58 = iVar16 - uVar15;
  if (iVar16 - uVar21 <= uVar15) {
    local_58 = uVar21;
  }
  if (ms->loadedDictEnd != 0) {
    local_58 = uVar21;
  }
  local_5c = rep[1];
  local_58 = iVar16 - local_58;
  local_b0 = local_5c;
  if (local_58 < local_5c) {
    local_b0 = 0;
  }
  uVar21 = local_54;
  if (local_58 < local_54) {
    uVar21 = 0;
  }
  uVar22 = (ulong)uVar21;
  local_88 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (puVar10 < local_88) {
    puVar17 = (ulong *)((long)puVar19 + -7);
    local_70 = (ulong *)((long)puVar19 + -3);
    local_78 = (ulong *)((long)puVar19 + -1);
    local_40 = puVar19 + -4;
    local_a8 = ms;
    local_a0 = puVar19;
    local_98 = puVar17;
    local_50 = seqStore;
    local_38 = rep;
    do {
      uVar21 = (uint)uVar22;
      local_68 = -uVar22;
      if (uVar21 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        if (*(int *)(((long)puVar10 + 1) - uVar22) == *(int *)((long)puVar10 + 1)) {
          puVar5 = (ulong *)((long)puVar10 + 5);
          puVar7 = (ulong *)((long)puVar10 + local_68 + 5);
          puVar14 = puVar5;
          if (puVar5 < puVar17) {
            if (*puVar7 == *puVar5) {
              lVar8 = 0;
              do {
                puVar14 = (ulong *)((long)puVar10 + lVar8 + 0xd);
                if (puVar17 <= puVar14) {
                  puVar7 = (ulong *)((long)puVar10 + local_68 + lVar8 + 0xd);
                  puVar14 = (ulong *)((long)puVar10 + lVar8 + 0xd);
                  goto LAB_00168bbf;
                }
                uVar9 = *(ulong *)((long)puVar10 + lVar8 + local_68 + 0xd);
                uVar13 = *puVar14;
                lVar8 = lVar8 + 8;
              } while (uVar9 == uVar13);
              uVar13 = uVar13 ^ uVar9;
              uVar9 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              uVar9 = (uVar9 >> 3 & 0x1fffffff) + lVar8;
            }
            else {
              uVar13 = *puVar5 ^ *puVar7;
              uVar9 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              uVar9 = uVar9 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00168bbf:
            if ((puVar14 < local_70) && ((int)*puVar7 == (int)*puVar14)) {
              puVar14 = (ulong *)((long)puVar14 + 4);
              puVar7 = (ulong *)((long)puVar7 + 4);
            }
            if ((puVar14 < local_78) && ((short)*puVar7 == (short)*puVar14)) {
              puVar14 = (ulong *)((long)puVar14 + 2);
              puVar7 = (ulong *)((long)puVar7 + 2);
            }
            if (puVar14 < puVar19) {
              puVar14 = (ulong *)((long)puVar14 + (ulong)((BYTE)*puVar7 == (BYTE)*puVar14));
            }
            uVar9 = (long)puVar14 - (long)puVar5;
          }
          uVar9 = uVar9 + 4;
        }
      }
      local_b8 = 999999999;
      if (local_ac == 6) {
        uVar13 = ZSTD_BtFindBestMatch_noDict_6(local_a8,(BYTE *)puVar10,(BYTE *)puVar19,&local_b8);
      }
      else if (local_ac == 5) {
        uVar13 = ZSTD_BtFindBestMatch_noDict_5(local_a8,(BYTE *)puVar10,(BYTE *)puVar19,&local_b8);
      }
      else {
        uVar13 = ZSTD_BtFindBestMatch_noDict_4(local_a8,(BYTE *)puVar10,(BYTE *)puVar19,&local_b8);
      }
      uVar18 = uVar9;
      if (uVar9 < uVar13) {
        uVar18 = uVar13;
      }
      if (uVar18 < 4) {
        uVar9 = (long)puVar10 - (long)src;
        puVar10 = (ulong *)((long)puVar10 + (uVar9 >> 8) + 1);
        local_a8->lazySkipping = (uint)(0x7ff < uVar9);
        puVar17 = local_98;
        uVar15 = local_b0;
      }
      else {
        local_80 = puVar10;
        uVar22 = local_b8;
        if (uVar13 <= uVar9) {
          local_80 = (ulong *)((long)puVar10 + 1);
          uVar22 = 1;
        }
        if (puVar10 < local_88) {
          do {
            puVar19 = (ulong *)((long)puVar10 + 1);
            local_90 = uVar18;
            if (uVar22 == 0) {
              uVar22 = 0;
            }
            else if ((uVar21 != 0) && (*(int *)puVar19 == *(int *)((long)puVar19 + local_68))) {
              puVar17 = (ulong *)((long)puVar10 + 5);
              puVar14 = (ulong *)((long)puVar10 + local_68 + 5);
              puVar5 = puVar17;
              if (puVar17 < local_98) {
                if (*puVar14 == *puVar17) {
                  puVar5 = (ulong *)((long)puVar10 + 0xd);
                  do {
                    if (local_98 <= puVar5) {
                      puVar14 = (ulong *)((long)puVar5 + local_68);
                      goto LAB_00168d94;
                    }
                    puVar14 = (ulong *)((long)puVar5 + local_68);
                    uVar9 = *puVar5;
                    puVar5 = puVar5 + 1;
                  } while (*puVar14 == uVar9);
                  uVar9 = uVar9 ^ *puVar14;
                  uVar13 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  puVar5 = (ulong *)((long)puVar5 + ((uVar13 >> 3 & 0x1fffffff) - 8));
                  goto LAB_00168dd6;
                }
                uVar13 = *puVar17 ^ *puVar14;
                uVar9 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                  }
                }
                uVar9 = uVar9 >> 3 & 0x1fffffff;
              }
              else {
LAB_00168d94:
                if ((puVar5 < local_70) && ((int)*puVar14 == (int)*puVar5)) {
                  puVar5 = (ulong *)((long)puVar5 + 4);
                  puVar14 = (ulong *)((long)puVar14 + 4);
                }
                if ((puVar5 < local_78) && ((short)*puVar14 == (short)*puVar5)) {
                  puVar5 = (ulong *)((long)puVar5 + 2);
                  puVar14 = (ulong *)((long)puVar14 + 2);
                }
                if (puVar5 < local_a0) {
                  puVar5 = (ulong *)((long)puVar5 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar5));
                }
LAB_00168dd6:
                uVar9 = (long)puVar5 - (long)puVar17;
                if (0xfffffffffffffffb < uVar9) goto LAB_00168e0e;
              }
              uVar15 = 0x1f;
              if ((uint)uVar22 != 0) {
                for (; (uint)uVar22 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              if ((int)((uVar15 ^ 0x1f) + (int)uVar18 * 3 + -0x1e) < (int)(uVar9 + 4) * 3) {
                uVar22 = 1;
                local_90 = uVar9 + 4;
                local_80 = puVar19;
              }
            }
LAB_00168e0e:
            local_b8 = 999999999;
            if (local_ac == 6) {
              uVar9 = ZSTD_BtFindBestMatch_noDict_6
                                (local_a8,(BYTE *)puVar19,(BYTE *)local_a0,&local_b8);
            }
            else if (local_ac == 5) {
              uVar9 = ZSTD_BtFindBestMatch_noDict_5
                                (local_a8,(BYTE *)puVar19,(BYTE *)local_a0,&local_b8);
            }
            else {
              uVar9 = ZSTD_BtFindBestMatch_noDict_4
                                (local_a8,(BYTE *)puVar19,(BYTE *)local_a0,&local_b8);
            }
            uVar15 = (uint)uVar22;
            if (uVar9 < 4) {
LAB_00168e78:
              uVar18 = local_90;
              if (local_88 <= puVar19) break;
              puVar19 = (ulong *)((long)puVar10 + 2);
              if (uVar22 == 0) {
                uVar22 = 0;
              }
              else if ((uVar21 != 0) && (*(int *)puVar19 == *(int *)((long)puVar19 + local_68))) {
                puVar17 = (ulong *)((long)puVar10 + 6);
                puVar5 = (ulong *)((long)puVar10 + local_68 + 6);
                puVar14 = puVar17;
                if (puVar17 < local_98) {
                  if (*puVar5 == *puVar17) {
                    puVar14 = (ulong *)((long)puVar10 + 0xe);
                    do {
                      if (local_98 <= puVar14) {
                        puVar5 = (ulong *)(local_68 + (long)puVar14);
                        goto LAB_00168f30;
                      }
                      puVar10 = (ulong *)((long)puVar14 + local_68);
                      uVar9 = *puVar14;
                      puVar14 = puVar14 + 1;
                    } while (*puVar10 == uVar9);
                    uVar9 = uVar9 ^ *puVar10;
                    uVar13 = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    puVar14 = (ulong *)((long)puVar14 + ((uVar13 >> 3 & 0x1fffffff) - 8));
                    goto LAB_00168f71;
                  }
                  uVar13 = *puVar17 ^ *puVar5;
                  uVar9 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                    }
                  }
                  uVar9 = uVar9 >> 3 & 0x1fffffff;
                }
                else {
LAB_00168f30:
                  if ((puVar14 < local_70) && ((int)*puVar5 == (int)*puVar14)) {
                    puVar14 = (ulong *)((long)puVar14 + 4);
                    puVar5 = (ulong *)((long)puVar5 + 4);
                  }
                  if ((puVar14 < local_78) && ((short)*puVar5 == (short)*puVar14)) {
                    puVar14 = (ulong *)((long)puVar14 + 2);
                    puVar5 = (ulong *)((long)puVar5 + 2);
                  }
                  if (puVar14 < local_a0) {
                    puVar14 = (ulong *)((long)puVar14 + (ulong)((BYTE)*puVar5 == (BYTE)*puVar14));
                  }
LAB_00168f71:
                  uVar9 = (long)puVar14 - (long)puVar17;
                  if (0xfffffffffffffffb < uVar9) goto LAB_00168fab;
                }
                uVar11 = 0x1f;
                if (uVar15 != 0) {
                  for (; uVar15 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                if ((int)((uVar11 ^ 0x1f) + (int)local_90 * 4 + -0x1e) < (int)(uVar9 + 4) * 4) {
                  uVar22 = 1;
                  local_90 = uVar9 + 4;
                  local_80 = puVar19;
                }
              }
LAB_00168fab:
              local_b8 = 999999999;
              if (local_ac == 6) {
                uVar9 = ZSTD_BtFindBestMatch_noDict_6
                                  (local_a8,(BYTE *)puVar19,(BYTE *)local_a0,&local_b8);
              }
              else if (local_ac == 5) {
                uVar9 = ZSTD_BtFindBestMatch_noDict_5
                                  (local_a8,(BYTE *)puVar19,(BYTE *)local_a0,&local_b8);
              }
              else {
                uVar9 = ZSTD_BtFindBestMatch_noDict_4
                                  (local_a8,(BYTE *)puVar19,(BYTE *)local_a0,&local_b8);
              }
              uVar18 = local_90;
              if (uVar9 < 4) break;
              uVar15 = 0x1f;
              if ((uint)uVar22 != 0) {
                for (; (uint)uVar22 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              iVar16 = 0x1f;
              if ((uint)local_b8 != 0) {
                for (; (uint)local_b8 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                }
              }
              if ((int)uVar9 * 4 - iVar16 <= (int)((uVar15 ^ 0x1f) + (int)local_90 * 4 + -0x18))
              break;
            }
            else {
              uVar11 = 0x1f;
              if (uVar15 != 0) {
                for (; uVar15 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              iVar16 = 0x1f;
              if ((uint)local_b8 != 0) {
                for (; (uint)local_b8 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                }
              }
              if ((int)uVar9 * 4 - iVar16 <= (int)((uVar11 ^ 0x1f) + (int)local_90 * 4 + -0x1b))
              goto LAB_00168e78;
            }
            puVar10 = puVar19;
            uVar18 = uVar9;
            uVar22 = local_b8;
            local_80 = puVar10;
          } while (puVar10 < local_88);
        }
        psVar4 = local_50;
        puVar10 = local_80;
        local_bc = uVar21;
        if (3 < uVar22) {
          if ((src < local_80) && (local_48 < (BYTE *)((long)local_80 + (3 - uVar22)))) {
            puVar19 = local_80;
            while (puVar10 = puVar19,
                  *(BYTE *)((long)puVar19 + -1) == *(BYTE *)((long)puVar19 + (2 - uVar22))) {
              puVar10 = (ulong *)((long)puVar19 + -1);
              uVar18 = uVar18 + 1;
              if ((puVar10 <= src) ||
                 (pBVar20 = (BYTE *)((long)puVar19 + (2 - uVar22)), puVar19 = puVar10,
                 pBVar20 <= local_48)) break;
            }
          }
          local_bc = (U32)uVar22 - 3;
          local_b0 = uVar21;
        }
        if (local_50->maxNbSeq <=
            (ulong)((long)local_50->sequences - (long)local_50->sequencesStart >> 3)) {
LAB_001694de:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_50->maxNbLit) {
LAB_001694fd:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar9 = (long)puVar10 - (long)src;
        puVar19 = (ulong *)local_50->lit;
        if (local_50->litStart + local_50->maxNbLit < (BYTE *)((long)puVar19 + uVar9)) {
LAB_001694bf:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_a0 < puVar10) {
LAB_001694a0:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < puVar10) {
          ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar10,(BYTE *)local_40);
LAB_00169128:
          psVar4->lit = psVar4->lit + uVar9;
          if (0xffff < uVar9) {
            if (psVar4->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            psVar4->longLengthType = ZSTD_llt_literalLength;
            psVar4->longLengthPos =
                 (U32)((ulong)((long)psVar4->sequences - (long)psVar4->sequencesStart) >> 3);
          }
        }
        else {
          uVar13 = *(ulong *)((long)src + 8);
          *puVar19 = *src;
          puVar19[1] = uVar13;
          pBVar20 = local_50->lit;
          if (0x10 < uVar9) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar20 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar13 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar20 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar20 + 0x18) = uVar13;
            if (0x20 < (long)uVar9) {
              lVar8 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar8 + 0x20);
                uVar3 = puVar2[1];
                pBVar1 = pBVar20 + lVar8 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar3;
                puVar2 = (undefined8 *)((long)src + lVar8 + 0x30);
                uVar3 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar3;
                lVar8 = lVar8 + 0x20;
              } while (pBVar1 + 0x20 < pBVar20 + uVar9);
            }
            goto LAB_00169128;
          }
          local_50->lit = pBVar20 + uVar9;
        }
        puVar19 = local_a0;
        psVar6 = psVar4->sequences;
        psVar6->litLength = (U16)uVar9;
        psVar6->offBase = (U32)uVar22;
        if (uVar18 < 3) {
LAB_0016951c:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar18 - 3) {
          if (psVar4->longLengthType != ZSTD_llt_none) {
LAB_0016953b:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar4->longLengthType = ZSTD_llt_matchLength;
          psVar4->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar4->sequencesStart) >> 3);
        }
        psVar6->mlBase = (U16)(uVar18 - 3);
        psVar6 = psVar6 + 1;
        psVar4->sequences = psVar6;
        if (local_a8->lazySkipping != 0) {
          local_a8->lazySkipping = 0;
        }
        puVar10 = (ulong *)((long)puVar10 + uVar18);
        puVar17 = local_98;
        if ((local_b0 == 0) || (local_88 < puVar10)) {
          src = puVar10;
          uVar22 = (ulong)local_bc;
          uVar15 = local_b0;
        }
        else {
          uVar22 = (ulong)local_bc;
          uVar9 = (ulong)local_b0;
          while( true ) {
            uVar13 = uVar9;
            uVar9 = uVar22;
            uVar21 = (uint)uVar9;
            src = puVar10;
            uVar22 = uVar9;
            uVar15 = (uint)uVar13;
            if ((int)*puVar10 != *(int *)((long)puVar10 - uVar13)) break;
            lVar8 = -uVar13;
            puVar5 = (ulong *)((long)puVar10 + 4);
            puVar7 = (ulong *)((long)puVar10 + lVar8 + 4);
            puVar14 = puVar5;
            if (puVar5 < puVar17) {
              if (*puVar7 == *puVar5) {
                lVar12 = 0;
                do {
                  puVar14 = (ulong *)((long)puVar10 + lVar12 + 0xc);
                  if (puVar17 <= puVar14) {
                    puVar7 = (ulong *)((long)puVar10 + lVar8 + lVar12 + 0xc);
                    puVar14 = (ulong *)((long)puVar10 + lVar12 + 0xc);
                    goto LAB_001692ef;
                  }
                  uVar22 = *(ulong *)((long)puVar10 + lVar12 + lVar8 + 0xc);
                  uVar18 = *puVar14;
                  lVar12 = lVar12 + 8;
                } while (uVar22 == uVar18);
                uVar18 = uVar18 ^ uVar22;
                uVar22 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar12;
              }
              else {
                uVar18 = *puVar5 ^ *puVar7;
                uVar22 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001692ef:
              if ((puVar14 < local_70) && ((int)*puVar7 == (int)*puVar14)) {
                puVar14 = (ulong *)((long)puVar14 + 4);
                puVar7 = (ulong *)((long)puVar7 + 4);
              }
              if ((puVar14 < local_78) && ((short)*puVar7 == (short)*puVar14)) {
                puVar14 = (ulong *)((long)puVar14 + 2);
                puVar7 = (ulong *)((long)puVar7 + 2);
              }
              if (puVar14 < puVar19) {
                puVar14 = (ulong *)((long)puVar14 + (ulong)((BYTE)*puVar7 == (BYTE)*puVar14));
              }
              uVar22 = (long)puVar14 - (long)puVar5;
            }
            if (psVar4->maxNbSeq <= (ulong)((long)psVar6 - (long)psVar4->sequencesStart >> 3))
            goto LAB_001694de;
            if (0x20000 < psVar4->maxNbLit) goto LAB_001694fd;
            puVar5 = (ulong *)psVar4->lit;
            if (psVar4->litStart + psVar4->maxNbLit < puVar5) goto LAB_001694bf;
            if (puVar19 < puVar10) goto LAB_001694a0;
            if (local_40 < puVar10) {
              ZSTD_safecopyLiterals((BYTE *)puVar5,(BYTE *)puVar10,(BYTE *)puVar10,(BYTE *)local_40)
              ;
              puVar17 = local_98;
            }
            else {
              uVar18 = puVar10[1];
              *puVar5 = *puVar10;
              puVar5[1] = uVar18;
            }
            psVar6 = psVar4->sequences;
            psVar6->litLength = 0;
            psVar6->offBase = 1;
            if (uVar22 + 4 < 3) goto LAB_0016951c;
            if (0xffff < uVar22 + 1) {
              if (psVar4->longLengthType != ZSTD_llt_none) goto LAB_0016953b;
              psVar4->longLengthType = ZSTD_llt_matchLength;
              psVar4->longLengthPos =
                   (U32)((ulong)((long)psVar6 - (long)psVar4->sequencesStart) >> 3);
            }
            psVar6->mlBase = (U16)(uVar22 + 1);
            psVar6 = psVar6 + 1;
            psVar4->sequences = psVar6;
            puVar10 = (ulong *)((long)puVar10 + uVar22 + 4);
            src = puVar10;
            uVar22 = uVar13;
            uVar15 = uVar21;
            if ((uVar21 == 0) || (local_88 < puVar10)) break;
          }
        }
      }
      uVar21 = (uint)uVar22;
      rep = local_38;
      local_b0 = uVar15;
    } while (puVar10 < local_88);
  }
  if (local_5c <= local_58) {
    local_5c = 0;
  }
  uVar15 = local_5c;
  if (uVar21 != 0) {
    uVar15 = local_54;
  }
  if (local_54 <= local_58) {
    uVar15 = local_5c;
    local_54 = 0;
  }
  if (uVar21 != 0) {
    local_54 = uVar21;
  }
  if (local_b0 != 0) {
    uVar15 = local_b0;
  }
  *rep = local_54;
  rep[1] = uVar15;
  return (long)puVar19 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}